

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  _Rb_tree_header *p_Var1;
  string *s;
  cmCTest *pcVar2;
  bool bVar3;
  __type _Var4;
  ostream *poVar5;
  bool collapse;
  pointer __lhs;
  char *local_478 [4];
  cmCTestTestProperties test;
  ostringstream cmCTestLog_msg_3;
  
  s = (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
  poVar5 = std::operator<<((ostream *)&test,"Add test: ");
  poVar5 = std::operator<<(poVar5,(string *)
                                  (args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x936,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&test);
  if (((this->UseExcludeRegExpFlag == true) && (this->UseExcludeRegExpFirst == true)) &&
     (bVar3 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,s), bVar3)) {
    return true;
  }
  __lhs = (this->CustomTestsIgnore).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (this->MemCheck == false) {
    for (; __lhs != (this->CustomTestsIgnore).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var4 = std::operator==(__lhs,s);
      if (_Var4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
        poVar5 = std::operator<<((ostream *)&test,"Ignore test: ");
        poVar5 = std::operator<<(poVar5,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x957,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
        goto LAB_0018803b;
      }
    }
  }
  else {
    for (; __lhs != (this->CustomTestsIgnore).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      _Var4 = std::operator==(__lhs,s);
      if (_Var4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&test);
        poVar5 = std::operator<<((ostream *)&test,"Ignore memcheck: ");
        poVar5 = std::operator<<(poVar5,(string *)__lhs);
        std::endl<char,std::char_traits<char>>(poVar5);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
                     ,0x948,_cmCTestLog_msg_3,(this->super_cmCTestGenericHandler).Quiet);
LAB_0018803b:
        std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&test);
        return true;
      }
    }
  }
  test.Name._M_dataplus._M_p = (pointer)&test.Name.field_2;
  test.Name._M_string_length = 0;
  test.Name.field_2._M_local_buf[0] = '\0';
  test.Directory._M_dataplus._M_p = (pointer)&test.Directory.field_2;
  test.Directory._M_string_length = 0;
  test.Directory.field_2._M_local_buf[0] = '\0';
  p_Var1 = &test.Measurements._M_t._M_impl.super__Rb_tree_header;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  memset(&test.Args,0,0xc0);
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.Affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  test.Affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  test.Affinity.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  test.Environment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test.Environment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test.Environment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.Labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  test.Labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  test.Labels.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.FixturesSetup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &test.FixturesSetup._M_t._M_impl.super__Rb_tree_header._M_header;
  test.FixturesSetup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.FixturesSetup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  test.FixturesSetup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.FixturesCleanup._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &test.FixturesCleanup._M_t._M_impl.super__Rb_tree_header._M_header;
  test.FixturesCleanup._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.FixturesCleanup._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  test.FixturesCleanup._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.FixturesRequired._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &test.FixturesRequired._M_t._M_impl.super__Rb_tree_header._M_header;
  test.FixturesRequired._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.FixturesRequired._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  test.FixturesRequired._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.RequireSuccessDepends._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &test.RequireSuccessDepends._M_t._M_impl.super__Rb_tree_header._M_header;
  test.RequireSuccessDepends._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  test.RequireSuccessDepends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  test.RequireSuccessDepends._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  test.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  test.Backtrace.TopEntry.
  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  test.FixturesSetup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       test.FixturesSetup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  test.FixturesCleanup._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       test.FixturesCleanup._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  test.FixturesRequired._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       test.FixturesRequired._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  test.RequireSuccessDepends._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       test.RequireSuccessDepends._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_assign((string *)&test);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&test.Args,args);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&cmCTestLog_msg_3,(SystemTools *)0x1,collapse);
  std::__cxx11::string::operator=((string *)&test.Directory,(string *)&cmCTestLog_msg_3);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_3);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg_3,"Set test directory: ");
  poVar5 = std::operator<<(poVar5,(string *)&test.Directory);
  std::endl<char,std::char_traits<char>>(poVar5);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x962,local_478[0],(this->super_cmCTestGenericHandler).Quiet);
  std::__cxx11::string::~string((string *)local_478);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_3);
  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.Disabled = false;
  test.RunSerial = false;
  test.Timeout.__r = 0.0;
  test.ExplicitTimeout = false;
  test.Cost = 0.0;
  test.PreviousRuns = 0;
  test.Processors = 1;
  test.WantAffinity = false;
  test.SkipReturnCode = -1;
  if (((this->UseIncludeRegExpFlag == true) &&
      (bVar3 = cmsys::RegularExpression::find(&this->IncludeTestsRegularExpression,s), !bVar3)) ||
     ((this->UseExcludeRegExpFlag == true &&
      ((this->UseExcludeRegExpFirst == false &&
       (bVar3 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,s), bVar3))))))
  {
    test._304_2_ = test._304_2_ & 0xff00;
  }
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::push_back(&this->TestList,&test);
  cmCTestTestProperties::~cmCTestTestProperties(&test);
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
                     this->Quiet);

  if (this->UseExcludeRegExpFlag && this->UseExcludeRegExpFirst &&
      this->ExcludeTestsRegularExpression.find(testname)) {
    return true;
  }
  if (this->MemCheck) {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
    }
  } else {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore test: " << *it << std::endl, this->Quiet);
      return true;
    }
  }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Set test directory: " << test.Directory << std::endl,
                     this->Quiet);

  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.Disabled = false;
  test.RunSerial = false;
  test.Timeout = cmDuration::zero();
  test.ExplicitTimeout = false;
  test.Cost = 0;
  test.Processors = 1;
  test.WantAffinity = false;
  test.SkipReturnCode = -1;
  test.PreviousRuns = 0;
  if (this->UseIncludeRegExpFlag &&
      !this->IncludeTestsRegularExpression.find(testname)) {
    test.IsInBasedOnREOptions = false;
  } else if (this->UseExcludeRegExpFlag && !this->UseExcludeRegExpFirst &&
             this->ExcludeTestsRegularExpression.find(testname)) {
    test.IsInBasedOnREOptions = false;
  }
  this->TestList.push_back(test);
  return true;
}